

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partitioned_tuple_data.cpp
# Opt level: O3

void __thiscall
duckdb::PartitionedTupleData::PartitionedTupleData
          (PartitionedTupleData *this,PartitionedTupleDataType type_p,
          BufferManager *buffer_manager_p,shared_ptr<duckdb::TupleDataLayout,_true> *layout_ptr_p)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  type pTVar2;
  
  this->_vptr_PartitionedTupleData = (_func_int **)&PTR__PartitionedTupleData_024655e8;
  this->type = type_p;
  this->buffer_manager = buffer_manager_p;
  (this->layout_ptr).internal.
  super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (layout_ptr_p->internal).
       super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (layout_ptr_p->internal).
           super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  (this->layout_ptr).internal.
  super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1
  ;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  pTVar2 = shared_ptr<duckdb::TupleDataLayout,_true>::operator*(&this->layout_ptr);
  this->layout = pTVar2;
  this->count = 0;
  this->data_size = 0;
  (this->lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->partitions).
  super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->partitions).
  super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->partitions).
  super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

PartitionedTupleData::PartitionedTupleData(PartitionedTupleDataType type_p, BufferManager &buffer_manager_p,
                                           shared_ptr<TupleDataLayout> &layout_ptr_p)
    : type(type_p), buffer_manager(buffer_manager_p), layout_ptr(layout_ptr_p), layout(*layout_ptr), count(0),
      data_size(0) {
}